

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

char * helicsEndpointGetInfo(HelicsEndpoint end)

{
  undefined8 *puVar1;
  string *psVar2;
  
  puVar1 = (undefined8 *)0x0;
  if ((end != (HelicsEndpoint)0x0) && (*(int *)((long)end + 0x20) == -0x4bac6b3e)) {
    puVar1 = (undefined8 *)end;
  }
  if (puVar1 == (undefined8 *)0x0) {
    psVar2 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar2 = helics::Interface::getInfo_abi_cxx11_((Interface *)*puVar1);
  }
  return (psVar2->_M_dataplus)._M_p;
}

Assistant:

const char* helicsEndpointGetInfo(HelicsEndpoint end)
{
    auto* endObj = verifyEndpoint(end, nullptr);
    if (endObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = endObj->endPtr->getInfo();
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}